

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConcurrentAssertionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ConcurrentAssertionStatementSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          ConcurrentAssertionStatementSyntax *args_1)

{
  ConcurrentAssertionMemberSyntax *this_00;
  
  this_00 = (ConcurrentAssertionMemberSyntax *)allocate(this,0x48,8);
  slang::syntax::ConcurrentAssertionMemberSyntax::ConcurrentAssertionMemberSyntax
            (this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }